

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format.c
# Opt level: O2

char * list_english(int argc,char **argv)

{
  char *pcVar1;
  
  pcVar1 = format_list(argc,argv,list_english::buffer,0x80,"{0} and {1}","{0}, {1}","{0}, {1}",
                       "{0} and {1}");
  return pcVar1;
}

Assistant:

static char *list_english(int argc, const char **argv) {
    static char buffer[128];
    return format_list(argc, argv, buffer, sizeof(buffer),
        "{0} and {1}",
        "{0}, {1}",
        "{0}, {1}",
        "{0} and {1}");
}